

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inftrees.c
# Opt level: O0

int zng_inflate_table(codetype type,uint16_t *lens,uint codes,code **table,uint *bits,uint16_t *work
                     )

{
  ushort uVar1;
  ushort uVar2;
  undefined4 *puVar3;
  char cVar4;
  byte bVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  long *in_RCX;
  uint in_EDX;
  long in_RSI;
  int in_EDI;
  uint *in_R8;
  uint16_t *in_R9;
  uint mask;
  uint low;
  uint fill;
  uint incr;
  uint huff;
  uint used;
  int left;
  uint drop;
  uint curr;
  uint root;
  uint max;
  uint min;
  uint sym;
  uint len;
  uint local_e0;
  uint local_dc;
  ushort auStack_d8 [16];
  ushort auStack_b8 [22];
  uint local_8c;
  uint16_t *local_88;
  uint16_t *local_80;
  long local_78;
  uint16_t offs [16];
  uint16_t count [16];
  uint match;
  uint16_t *extra;
  uint16_t *base;
  code *next;
  code here;
  
  count[0xe] = 0;
  count[0xf] = 0;
  for (; (uint)count._28_4_ < 0x10; count._28_4_ = count._28_4_ + 1) {
    auStack_b8[(uint)count._28_4_] = 0;
  }
  count[0xc] = 0;
  count[0xd] = 0;
  for (; (uint)count._24_4_ < in_EDX; count._24_4_ = count._24_4_ + 1) {
    uVar1 = *(ushort *)(in_RSI + (ulong)(uint)count._24_4_ * 2);
    auStack_b8[uVar1] = auStack_b8[uVar1] + 1;
  }
  local_dc = *in_R8;
  count[8] = 0xf;
  count[9] = 0;
  for (; (count._16_4_ != 0 && (auStack_b8[(uint)count._16_4_] == 0));
      count._16_4_ = count._16_4_ + -1) {
  }
  if ((uint)count._16_4_ < local_dc) {
    local_dc._0_2_ = count[8];
    local_dc._2_2_ = count[9];
  }
  if (count._16_4_ == 0) {
    puVar3 = (undefined4 *)*in_RCX;
    *in_RCX = (long)(puVar3 + 1);
    *puVar3 = 0x140;
    puVar3 = (undefined4 *)*in_RCX;
    *in_RCX = (long)(puVar3 + 1);
    *puVar3 = 0x140;
    *in_R8 = 1;
    here.op = '\0';
    here.bits = '\0';
    here.val = 0;
  }
  else {
    count[10] = 1;
    count[0xb] = 0;
    for (; ((uint)count._20_4_ < (uint)count._16_4_ && (auStack_b8[(uint)count._20_4_] == 0));
        count._20_4_ = count._20_4_ + 1) {
    }
    if (local_dc < (uint)count._20_4_) {
      local_e0._0_2_ = count[10];
      local_e0._2_2_ = count[0xb];
    }
    else {
      local_e0 = local_dc;
    }
    count[0] = 1;
    count[1] = 0;
    count[0xe] = 1;
    count[0xf] = 0;
    for (; (uint)count._28_4_ < 0x10; count._28_4_ = count._28_4_ + 1) {
      count._0_4_ = count._0_4_ * 2 - (uint)auStack_b8[(uint)count._28_4_];
      if ((int)count._0_4_ < 0) {
        return -1;
      }
    }
    if (((int)count._0_4_ < 1) || ((in_EDI != 0 && (count._16_4_ == 1)))) {
      auStack_d8[1] = 0;
      count[0xe] = 1;
      count[0xf] = 0;
      for (; (uint)count._28_4_ < 0xf; count._28_4_ = count._28_4_ + 1) {
        auStack_d8[count._28_4_ + 1] =
             auStack_d8[(uint)count._28_4_] + auStack_b8[(uint)count._28_4_];
      }
      count[0xc] = 0;
      count[0xd] = 0;
      for (; (uint)count._24_4_ < in_EDX; count._24_4_ = count._24_4_ + 1) {
        if (*(short *)(in_RSI + (ulong)(uint)count._24_4_ * 2) != 0) {
          uVar1 = *(ushort *)(in_RSI + (ulong)(uint)count._24_4_ * 2);
          uVar2 = auStack_d8[uVar1];
          auStack_d8[uVar1] = uVar2 + 1;
          in_R9[uVar2] = (uint16_t)count._24_4_;
        }
      }
      if (in_EDI == 0) {
        local_8c = 0x14;
        local_88 = in_R9;
        local_80 = in_R9;
      }
      else if (in_EDI == 1) {
        local_80 = zng_inflate_table::lbase;
        local_88 = zng_inflate_table::lext;
        local_8c = 0x101;
      }
      else {
        local_80 = zng_inflate_table::dbase;
        local_88 = zng_inflate_table::dext;
        local_8c = 0;
      }
      offs[0xc] = 0;
      offs[0xd] = 0;
      count[0xc] = 0;
      count[0xd] = 0;
      count[0xe] = count[10];
      count[0xf] = count[0xb];
      local_78 = *in_RCX;
      count[4] = (undefined2)local_e0;
      count[5] = local_e0._2_2_;
      count[2] = 0;
      count[3] = 0;
      offs[6] = 0xffff;
      offs[7] = 0xffff;
      uVar6 = 1 << ((byte)local_e0 & 0x1f);
      offs[0xe] = (short)uVar6;
      offs[0xf] = (short)(uVar6 >> 0x10);
      offs._8_4_ = uVar6 - 1;
      if (((in_EDI == 1) && (0x534 < uVar6)) || ((in_EDI == 2 && (0x250 < uVar6)))) {
        here.op = '\x01';
        here.bits = '\0';
        here.val = 0;
      }
      else {
        while( true ) {
          do {
            bVar5 = (byte)count._4_4_;
            cVar4 = (char)count._28_4_;
            offs[2]._1_1_ = cVar4 - bVar5;
            offs[3] = 0;
            if (in_R9[(uint)count._24_4_] < local_8c) {
              if (in_R9[(uint)count._24_4_] + 1 < local_8c) {
                offs._4_4_ = (uint)CONCAT21(in_R9[(uint)count._24_4_],offs[2]._1_1_) << 8;
              }
              else {
                offs[2]._0_1_ = 0x60;
              }
            }
            else {
              offs[2]._0_1_ = (char)local_88[in_R9[(uint)count._24_4_] - local_8c];
              offs[3] = local_80[in_R9[(uint)count._24_4_] - local_8c];
            }
            uVar6 = 1 << ((byte)count._8_4_ & 0x1f);
            offs._16_4_ = uVar6;
            do {
              offs._16_4_ = offs._16_4_ - (1 << (cVar4 - bVar5 & 0x1f));
              *(undefined4 *)
               (local_78 + (ulong)(((uint)offs._24_4_ >> (bVar5 & 0x1f)) + offs._16_4_) * 4) =
                   offs._4_4_;
            } while (offs._16_4_ != 0);
            iVar7 = 1 << (cVar4 - 1U & 0x1f);
            offs[10] = (short)iVar7;
            offs[0xb] = (short)((uint)iVar7 >> 0x10);
            while ((offs._24_4_ & offs._20_4_) != 0) {
              uVar8 = (uint)offs._20_4_ >> 1;
              offs[10] = (short)uVar8;
              offs[0xb] = (short)(uVar8 >> 0x10);
            }
            if (offs._20_4_ == 0) {
              offs[0xc] = 0;
              offs[0xd] = 0;
            }
            else {
              offs._24_4_ = offs._20_4_ + (offs._20_4_ - 1 & offs._24_4_);
            }
            count._24_4_ = count._24_4_ + 1;
            uVar1 = auStack_b8[(uint)count._28_4_];
            auStack_b8[(uint)count._28_4_] = uVar1 - 1;
            if ((ushort)(uVar1 - 1) == 0) {
              if (count._28_4_ == count._16_4_) {
                if (offs._24_4_ != 0) {
                  offs[2]._1_1_ = cVar4 - bVar5;
                  offs[2]._0_1_ = 0x40;
                  offs[3] = 0;
                  *(undefined4 *)(local_78 + (ulong)(uint)offs._24_4_ * 4) = offs._4_4_;
                }
                *in_RCX = *in_RCX + (ulong)(uint)offs._28_4_ * 4;
                *in_R8 = local_e0;
                return 0;
              }
              count._28_4_ = ZEXT24(*(ushort *)(in_RSI + (ulong)in_R9[(uint)count._24_4_] * 2));
            }
          } while (((uint)count._28_4_ <= local_e0) || ((offs._24_4_ & offs._8_4_) == offs._12_4_));
          if (count._4_4_ == 0) {
            count[2] = (undefined2)local_e0;
            count[3] = local_e0._2_2_;
          }
          local_78 = local_78 + (ulong)uVar6 * 4;
          count._8_4_ = count._28_4_ - count._4_4_;
          for (count._0_4_ = 1 << ((byte)count._8_4_ & 0x1f);
              ((uint)(count._8_4_ + count._4_4_) < (uint)count._16_4_ &&
              (uVar6 = count._8_4_ + count._4_4_, 0 < (int)(count._0_4_ - (uint)auStack_b8[uVar6])))
              ; count._0_4_ = (count._0_4_ - (uint)auStack_b8[uVar6]) * 2) {
            count._8_4_ = count._8_4_ + 1;
          }
          offs._28_4_ = (1 << ((byte)count._8_4_ & 0x1f)) + offs._28_4_;
          if (((in_EDI == 1) && (0x534 < (uint)offs._28_4_)) ||
             ((in_EDI == 2 && (0x250 < (uint)offs._28_4_)))) break;
          uVar6 = offs._24_4_ & offs._8_4_;
          offs[6] = (short)uVar6;
          offs[7] = (short)(uVar6 >> 0x10);
          *(byte *)(*in_RCX + (ulong)uVar6 * 4) = (byte)count._8_4_;
          *(byte *)(*in_RCX + 1 + (ulong)uVar6 * 4) = (byte)local_e0;
          *(short *)(*in_RCX + 2 + (ulong)uVar6 * 4) = (short)(local_78 - *in_RCX >> 2);
        }
        here.op = '\x01';
        here.bits = '\0';
        here.val = 0;
      }
    }
    else {
      here.op = 0xff;
      here.bits = 0xff;
      here.val = 0xffff;
    }
  }
  iVar7._0_1_ = here.op;
  iVar7._1_1_ = here.bits;
  iVar7._2_2_ = here.val;
  return iVar7;
}

Assistant:

int Z_INTERNAL zng_inflate_table(codetype type, uint16_t *lens, unsigned codes,
                                code * *table, unsigned *bits, uint16_t *work) {
    unsigned len;               /* a code's length in bits */
    unsigned sym;               /* index of code symbols */
    unsigned min, max;          /* minimum and maximum code lengths */
    unsigned root;              /* number of index bits for root table */
    unsigned curr;              /* number of index bits for current table */
    unsigned drop;              /* code bits to drop for sub-table */
    int left;                   /* number of prefix codes available */
    unsigned used;              /* code entries in table used */
    unsigned huff;              /* Huffman code */
    unsigned incr;              /* for incrementing code, index */
    unsigned fill;              /* index for replicating entries */
    unsigned low;               /* low bits for current root entry */
    unsigned mask;              /* mask for low root bits */
    code here;                  /* table entry for duplication */
    code *next;                 /* next available space in table */
    const uint16_t *base;       /* base value table to use */
    const uint16_t *extra;      /* extra bits table to use */
    unsigned match;             /* use base and extra for symbol >= match */
    uint16_t count[MAX_BITS+1];  /* number of codes of each length */
    uint16_t offs[MAX_BITS+1];   /* offsets in table for each length */
    static const uint16_t lbase[31] = { /* Length codes 257..285 base */
        3, 4, 5, 6, 7, 8, 9, 10, 11, 13, 15, 17, 19, 23, 27, 31,
        35, 43, 51, 59, 67, 83, 99, 115, 131, 163, 195, 227, 258, 0, 0};
    static const uint16_t lext[31] = { /* Length codes 257..285 extra */
        16, 16, 16, 16, 16, 16, 16, 16, 17, 17, 17, 17, 18, 18, 18, 18,
        19, 19, 19, 19, 20, 20, 20, 20, 21, 21, 21, 21, 16, 203, 77};
    static const uint16_t dbase[32] = { /* Distance codes 0..29 base */
        1, 2, 3, 4, 5, 7, 9, 13, 17, 25, 33, 49, 65, 97, 129, 193,
        257, 385, 513, 769, 1025, 1537, 2049, 3073, 4097, 6145,
        8193, 12289, 16385, 24577, 0, 0};
    static const uint16_t dext[32] = { /* Distance codes 0..29 extra */
        16, 16, 16, 16, 17, 17, 18, 18, 19, 19, 20, 20, 21, 21, 22, 22,
        23, 23, 24, 24, 25, 25, 26, 26, 27, 27,
        28, 28, 29, 29, 64, 64};

    /*
       Process a set of code lengths to create a canonical Huffman code.  The
       code lengths are lens[0..codes-1].  Each length corresponds to the
       symbols 0..codes-1.  The Huffman code is generated by first sorting the
       symbols by length from short to long, and retaining the symbol order
       for codes with equal lengths.  Then the code starts with all zero bits
       for the first code of the shortest length, and the codes are integer
       increments for the same length, and zeros are appended as the length
       increases.  For the deflate format, these bits are stored backwards
       from their more natural integer increment ordering, and so when the
       decoding tables are built in the large loop below, the integer codes
       are incremented backwards.

       This routine assumes, but does not check, that all of the entries in
       lens[] are in the range 0..MAXBITS.  The caller must assure this.
       1..MAXBITS is interpreted as that code length.  zero means that that
       symbol does not occur in this code.

       The codes are sorted by computing a count of codes for each length,
       creating from that a table of starting indices for each length in the
       sorted table, and then entering the symbols in order in the sorted
       table.  The sorted table is work[], with that space being provided by
       the caller.

       The length counts are used for other purposes as well, i.e. finding
       the minimum and maximum length codes, determining if there are any
       codes at all, checking for a valid set of lengths, and looking ahead
       at length counts to determine sub-table sizes when building the
       decoding tables.
     */

    /* accumulate lengths for codes (assumes lens[] all in 0..MAXBITS) */
    for (len = 0; len <= MAX_BITS; len++)
        count[len] = 0;
    for (sym = 0; sym < codes; sym++)
        count[lens[sym]]++;

    /* bound code lengths, force root to be within code lengths */
    root = *bits;
    for (max = MAX_BITS; max >= 1; max--)
        if (count[max] != 0) break;
    root = MIN(root, max);
    if (UNLIKELY(max == 0)) {           /* no symbols to code at all */
        here.op = (unsigned char)64;    /* invalid code marker */
        here.bits = (unsigned char)1;
        here.val = (uint16_t)0;
        *(*table)++ = here;             /* make a table to force an error */
        *(*table)++ = here;
        *bits = 1;
        return 0;     /* no symbols, but wait for decoding to report error */
    }
    for (min = 1; min < max; min++)
        if (count[min] != 0) break;
    root = MAX(root, min);

    /* check for an over-subscribed or incomplete set of lengths */
    left = 1;
    for (len = 1; len <= MAX_BITS; len++) {
        left <<= 1;
        left -= count[len];
        if (left < 0) return -1;        /* over-subscribed */
    }
    if (left > 0 && (type == CODES || max != 1))
        return -1;                      /* incomplete set */

    /* generate offsets into symbol table for each length for sorting */
    offs[1] = 0;
    for (len = 1; len < MAX_BITS; len++)
        offs[len + 1] = offs[len] + count[len];

    /* sort symbols by length, by symbol order within each length */
    for (sym = 0; sym < codes; sym++)
        if (lens[sym] != 0) work[offs[lens[sym]]++] = (uint16_t)sym;

    /*
       Create and fill in decoding tables.  In this loop, the table being
       filled is at next and has curr index bits.  The code being used is huff
       with length len.  That code is converted to an index by dropping drop
       bits off of the bottom.  For codes where len is less than drop + curr,
       those top drop + curr - len bits are incremented through all values to
       fill the table with replicated entries.

       root is the number of index bits for the root table.  When len exceeds
       root, sub-tables are created pointed to by the root entry with an index
       of the low root bits of huff.  This is saved in low to check for when a
       new sub-table should be started.  drop is zero when the root table is
       being filled, and drop is root when sub-tables are being filled.

       When a new sub-table is needed, it is necessary to look ahead in the
       code lengths to determine what size sub-table is needed.  The length
       counts are used for this, and so count[] is decremented as codes are
       entered in the tables.

       used keeps track of how many table entries have been allocated from the
       provided *table space.  It is checked for LENS and DIST tables against
       the constants ENOUGH_LENS and ENOUGH_DISTS to guard against changes in
       the initial root table size constants.  See the comments in inftrees.h
       for more information.

       sym increments through all symbols, and the loop terminates when
       all codes of length max, i.e. all codes, have been processed.  This
       routine permits incomplete codes, so another loop after this one fills
       in the rest of the decoding tables with invalid code markers.
     */

    /* set up for code type */
    switch (type) {
    case CODES:
        base = extra = work;    /* dummy value--not used */
        match = 20;
        break;
    case LENS:
        base = lbase;
        extra = lext;
        match = 257;
        break;
    default:    /* DISTS */
        base = dbase;
        extra = dext;
        match = 0;
    }

    /* initialize state for loop */
    huff = 0;                   /* starting code */
    sym = 0;                    /* starting code symbol */
    len = min;                  /* starting code length */
    next = *table;              /* current table to fill in */
    curr = root;                /* current table index bits */
    drop = 0;                   /* current bits to drop from code for index */
    low = (unsigned)(-1);       /* trigger new sub-table when len > root */
    used = 1U << root;          /* use root table entries */
    mask = used - 1;            /* mask for comparing low */

    /* check available table space */
    if ((type == LENS && used > ENOUGH_LENS) ||
        (type == DISTS && used > ENOUGH_DISTS))
        return 1;

    /* process all codes and make table entries */
    for (;;) {
        /* create table entry */
        here.bits = (unsigned char)(len - drop);
        if (LIKELY(work[sym] >= match)) {
            here.op = (unsigned char)(extra[work[sym] - match]);
            here.val = base[work[sym] - match];
        } else if (work[sym] + 1U < match) {
            here.op = (unsigned char)0;
            here.val = work[sym];
        } else {
            here.op = (unsigned char)(32 + 64);         /* end of block */
            here.val = 0;
        }

        /* replicate for those indices with low len bits equal to huff */
        incr = 1U << (len - drop);
        fill = 1U << curr;
        min = fill;                 /* save offset to next table */
        do {
            fill -= incr;
            next[(huff >> drop) + fill] = here;
        } while (fill != 0);

        /* backwards increment the len-bit code huff */
        incr = 1U << (len - 1);
        while (huff & incr)
            incr >>= 1;
        if (incr != 0) {
            huff &= incr - 1;
            huff += incr;
        } else {
            huff = 0;
        }

        /* go to next symbol, update count, len */
        sym++;
        if (--(count[len]) == 0) {
            if (len == max)
                break;
            len = lens[work[sym]];
        }

        /* create new sub-table if needed */
        if (len > root && (huff & mask) != low) {
            /* if first time, transition to sub-tables */
            if (drop == 0)
                drop = root;

            /* increment past last table */
            next += min;            /* here min is 1 << curr */

            /* determine length of next table */
            curr = len - drop;
            left = (int)(1 << curr);
            while (curr + drop < max) {
                left -= count[curr + drop];
                if (left <= 0)
                    break;
                curr++;
                left <<= 1;
            }

            /* check for enough space */
            used += 1U << curr;
            if ((type == LENS && used > ENOUGH_LENS) || (type == DISTS && used > ENOUGH_DISTS))
                return 1;

            /* point entry in root table to sub-table */
            low = huff & mask;
            (*table)[low].op = (unsigned char)curr;
            (*table)[low].bits = (unsigned char)root;
            (*table)[low].val = (uint16_t)(next - *table);
        }
    }

    /* fill in remaining table entry if code is incomplete (guaranteed to have
       at most one remaining entry, since if the code is incomplete, the
       maximum code length that was allowed to get this far is one bit) */
    if (UNLIKELY(huff != 0)) {
        here.op = (unsigned char)64;            /* invalid code marker */
        here.bits = (unsigned char)(len - drop);
        here.val = (uint16_t)0;
        next[huff] = here;
    }

    /* set return parameters */
    *table += used;
    *bits = root;
    return 0;
}